

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnnoise_demo.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  undefined1 auVar2 [12];
  int iVar3;
  DenoiseState *st;
  FILE *__stream;
  FILE *__s;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  short tmp [480];
  float x [480];
  ulong local_b78 [120];
  float local_7b8 [482];
  undefined1 auVar7 [16];
  undefined2 uVar10;
  
  st = rnnoise_create((RNNModel *)0x0);
  if (argc == 3) {
    __stream = fopen(argv[1],"rb");
    __s = fopen(argv[2],"wb");
    fread(local_b78,2,0x1e0,__stream);
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      bVar5 = false;
      do {
        lVar4 = 0;
        do {
          uVar1 = *(ulong *)((long)local_b78 + lVar4 * 2);
          uVar10 = (undefined2)(uVar1 >> 0x30);
          auVar7._8_4_ = 0;
          auVar7._0_8_ = uVar1;
          auVar7._12_2_ = uVar10;
          auVar7._14_2_ = uVar10;
          uVar10 = (undefined2)(uVar1 >> 0x20);
          auVar6._12_4_ = auVar7._12_4_;
          auVar6._8_2_ = 0;
          auVar6._0_8_ = uVar1;
          auVar6._10_2_ = uVar10;
          auVar9._10_6_ = auVar6._10_6_;
          auVar9._8_2_ = uVar10;
          auVar9._0_8_ = uVar1;
          uVar10 = (undefined2)(uVar1 >> 0x10);
          auVar2._4_8_ = auVar9._8_8_;
          auVar2._2_2_ = uVar10;
          auVar2._0_2_ = uVar10;
          local_7b8[lVar4] = (float)(int)(short)uVar1;
          local_7b8[lVar4 + 1] = (float)(auVar2._0_4_ >> 0x10);
          local_7b8[lVar4 + 2] = (float)(auVar9._8_4_ >> 0x10);
          local_7b8[lVar4 + 3] = (float)(auVar6._12_4_ >> 0x10);
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x1e0);
        rnnoise_process_frame(st,local_7b8,local_7b8);
        lVar4 = 0;
        do {
          auVar8._0_4_ = (int)local_7b8[lVar4];
          auVar8._4_4_ = (int)local_7b8[lVar4 + 1];
          auVar8._8_4_ = (int)local_7b8[lVar4 + 2];
          auVar8._12_4_ = (int)local_7b8[lVar4 + 3];
          auVar9 = packssdw(auVar8,auVar8);
          *(long *)((long)local_b78 + lVar4 * 2) = auVar9._0_8_;
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x1e0);
        if (bVar5) {
          fwrite(local_b78,2,0x1e0,__s);
        }
        fread(local_b78,2,0x1e0,__stream);
        iVar3 = feof(__stream);
        bVar5 = true;
      } while (iVar3 == 0);
    }
    rnnoise_destroy(st);
    fclose(__stream);
    fclose(__s);
    iVar3 = 0;
  }
  else {
    main_cold_1();
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int first = 1; // 标记是否是第一帧pcm
    float x[FRAME_SIZE];
    FILE *f1, *fout;
    DenoiseState *st;
    st = rnnoise_create(NULL);
    if (argc != 3) {
        fprintf(stderr, "usage: %s <noisy speech> <output denoised>\n", argv[0]);
        return 1;
    }
    f1 = fopen(argv[1], "rb");
    fout = fopen(argv[2], "wb");
    while (1) {
        short tmp[FRAME_SIZE];
        fread(tmp, sizeof(short), FRAME_SIZE, f1); // 从文件流中读数据
        if (feof(f1)) break; // 达到文件结尾
        for (i = 0; i < FRAME_SIZE; i++) x[i] = tmp[i];
        rnnoise_process_frame(st, x, x);
        for (i = 0; i < FRAME_SIZE; i++) tmp[i] = x[i];
        if (!first) fwrite(tmp, sizeof(short), FRAME_SIZE, fout);
        // 第一帧不处理不保存, 从第二帧开始保存, out文件自然会少一帧, 但不影响PESQ的测试
        // 一帧480个采样点,每个采样点short类型的2字节，少的一帧就是960字节
        first = 0;
    }
    rnnoise_destroy(st);
    fclose(f1);
    fclose(fout);
    return 0;
}